

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::RemoveExportBuildFileGeneratorCMP0024(cmMakefile *this,cmExportBuildFileGenerator *gen)

{
  cmExportBuildFileGenerator **__src;
  __normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
  __dest;
  cmExportBuildFileGenerator **ppcVar1;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<cmExportBuildFileGenerator**,std::vector<cmExportBuildFileGenerator*,std::allocator<cmExportBuildFileGenerator*>>>,__gnu_cxx::__ops::_Iter_equals_val<cmExportBuildFileGenerator*const>>
                     ((this->ExportBuildFileGenerators).
                      super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->ExportBuildFileGenerators).
                      super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  ppcVar1 = (this->ExportBuildFileGenerators).
            super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != ppcVar1) {
    __src = __dest._M_current + 1;
    if (__src != ppcVar1) {
      memmove(__dest._M_current,__src,(long)ppcVar1 - (long)__src);
      ppcVar1 = (this->ExportBuildFileGenerators).
                super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->ExportBuildFileGenerators).
    super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppcVar1 + -1;
  }
  return;
}

Assistant:

void cmMakefile::RemoveExportBuildFileGeneratorCMP0024(
  cmExportBuildFileGenerator* gen)
{
  std::vector<cmExportBuildFileGenerator*>::iterator it =
    std::find(this->ExportBuildFileGenerators.begin(),
              this->ExportBuildFileGenerators.end(), gen);
  if (it != this->ExportBuildFileGenerators.end()) {
    this->ExportBuildFileGenerators.erase(it);
  }
}